

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

shared_ptr<mocker::ir::Addr> __thiscall mocker::ir::Builder::makeILit(Builder *this,Integer val)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ir::Addr> sVar1;
  shared_ptr<mocker::ir::IntLiteral> local_30;
  Integer val_local;
  Builder *this_local;
  
  val_local = val;
  this_local = this;
  std::make_shared<mocker::ir::IntLiteral,long&>((long *)&local_30);
  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::IntLiteral,void>
            ((shared_ptr<mocker::ir::Addr> *)this,&local_30);
  std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Addr>)
         sVar1.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr> Builder::makeILit(Integer val) const {
  return std::make_shared<IntLiteral>(val);
}